

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O0

void __thiscall
pbrt::DielectricMaterial::DielectricMaterial
          (DielectricMaterial *this,FloatTextureHandle *uRoughness,FloatTextureHandle *vRoughness,
          FloatTextureHandle *etaF,SpectrumTextureHandle *etaS,FloatTextureHandle *displacement,
          bool remapRoughness)

{
  bool bVar1;
  bool bVar2;
  TaggedPointer *in_RCX;
  char *in_RDX;
  FloatTextureHandle *in_RSI;
  char *in_RDI;
  TaggedPointer *in_R8;
  FloatTextureHandle *in_R9;
  LogLevel unaff_retaddr;
  byte in_stack_00000008;
  TaggedPointer *args;
  FloatTextureHandle *pFVar3;
  int line;
  char *file;
  
  args = in_RCX;
  pFVar3 = in_RSI;
  file = in_RDI;
  FloatTextureHandle::FloatTextureHandle(in_RSI,in_R9);
  line = (int)((ulong)pFVar3 >> 0x20);
  FloatTextureHandle::FloatTextureHandle(in_RSI,in_R9);
  FloatTextureHandle::FloatTextureHandle(in_RSI,in_R9);
  FloatTextureHandle::FloatTextureHandle(in_RSI,in_R9);
  SpectrumTextureHandle::SpectrumTextureHandle
            ((SpectrumTextureHandle *)in_RSI,(SpectrumTextureHandle *)in_R9);
  in_RDI[0x28] = in_stack_00000008 & 1;
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(in_RCX);
  bVar2 = pbrt::TaggedPointer::operator_cast_to_bool(in_R8);
  if (bVar1 == bVar2) {
    LogFatal<char_const(&)[24]>(unaff_retaddr,file,line,in_RDX,(char (*) [24])args);
  }
  return;
}

Assistant:

DielectricMaterial(FloatTextureHandle uRoughness, FloatTextureHandle vRoughness,
                       FloatTextureHandle etaF, SpectrumTextureHandle etaS,
                       FloatTextureHandle displacement, bool remapRoughness)
        : displacement(displacement),
          uRoughness(uRoughness),
          vRoughness(vRoughness),
          etaF(etaF),
          etaS(etaS),
          remapRoughness(remapRoughness) {
        CHECK((bool)etaF ^ (bool)etaS);
    }